

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O2

bool node::DumpMempool(CTxMemPool *pool,path *dump_path,FopenFn mockable_fopen_function,
                      bool skip_file_commit)

{
  long lVar1;
  mapped_type mVar2;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  path src;
  path dest;
  pointer pTVar3;
  bool bVar4;
  int iVar5;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  long lVar9;
  _IO_FILE *file_00;
  long lVar10;
  runtime_error *this;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  char *p2;
  char *p2_00;
  TxMempoolInfo *i;
  pointer pTVar11;
  FILE *__stream;
  long in_FS_OFFSET;
  Span<std::byte> output;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  undefined1 in_stack_fffffffffffffd58 [12];
  path *__p;
  path *ppVar12;
  unsigned_long local_280;
  double local_278;
  uint64_t mempool_transactions_to_write;
  undefined1 local_268 [16];
  vector<std::byte,_std::allocator<std::byte>_> xor_key;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_238;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> vinfo;
  AutoFile file;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  path local_1c0;
  path local_198;
  path local_170;
  undefined1 local_148 [16];
  ChaCha20 local_138;
  path local_c0;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> mapDeltas
  ;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var6._M_head_impl = (_Impl *)std::chrono::_V2::steady_clock::now();
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
      ::dump_mutex == '\0') {
    iVar5 = __cxa_guard_acquire(&DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
                                 ::dump_mutex);
    if (iVar5 != 0) {
      __cxa_guard_release(&DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
                           ::dump_mutex);
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock8,&DumpMempool::dump_mutex,"dump_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
             ,0x9e,false);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&file,&pool->cs,"pool.cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
             ,0xa1,false);
  for (p_Var8 = (pool->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(pool->mapDeltas)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    mVar2 = *(mapped_type *)(p_Var8 + 2);
    pmVar7 = std::
             map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
             ::operator[](&mapDeltas,(key_type *)(p_Var8 + 1));
    *pmVar7 = mVar2;
  }
  CTxMemPool::infoAll((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)local_148,pool);
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::_M_move_assign
            (&vinfo,(vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)local_148);
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)local_148);
  CTxMemPool::GetUnbroadcastTxs
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)local_148,pool);
  __p = &dump_path->super_path;
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::operator=(&unbroadcast_txids._M_t,
              (_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)local_148);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)local_148);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&file);
  lVar9 = std::chrono::_V2::steady_clock::now();
  std::filesystem::__cxx11::path::path(&local_c0,&dump_path->super_path);
  fs::operator+((path *)local_148,(path *)&local_c0,p2);
  file_00 = std::function<_IO_FILE_*(const_fs::path_&,_const_char_*)>::operator()
                      ((function<_IO_FILE_*(const_fs::path_&,_const_char_*)> *)
                       CONCAT71(in_register_00000011,skip_file_commit),(path *)local_148,"wb");
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish._4_4_ = in_ECX;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._0_12_ = in_stack_fffffffffffffd58;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)__p;
  AutoFile::AutoFile(&file,file_00,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_238);
  std::filesystem::__cxx11::path::~path((path *)local_148);
  std::filesystem::__cxx11::path::~path(&local_c0);
  if (file.m_file == (FILE *)0x0) {
    bVar4 = false;
LAB_007a6be2:
    AutoFile::~AutoFile(&file);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock8.super_unique_lock);
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree(&unbroadcast_txids._M_t);
    std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector(&vinfo);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
    ::~_Rb_tree(&mapDeltas._M_t);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return bVar4;
    }
  }
  else {
    ser_writedata64<AutoFile>(&file,2 - (ulong)(pool->m_opts).persist_v1_dat);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&xor_key,8,(allocator_type *)local_148);
    if ((pool->m_opts).persist_v1_dat == false) {
      FastRandomContext::FastRandomContext((FastRandomContext *)local_148,false);
      output.m_size =
           (long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      output.m_data =
           xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      FastRandomContext::fillrand((FastRandomContext *)local_148,output);
      ChaCha20::~ChaCha20(&local_138);
      Serialize<AutoFile,std::byte,std::allocator<std::byte>>(&file,&xor_key);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)local_268,&xor_key);
    std::vector<std::byte,_std::allocator<std::byte>_>::operator=
              (&file.m_xor,(vector<std::byte,_std::allocator<std::byte>_> *)local_268);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)local_268);
    mempool_transactions_to_write =
         ((long)vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x30;
    ser_writedata64<AutoFile>(&file,mempool_transactions_to_write);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
    ;
    source_file._M_len = 0x68;
    logging_function._M_str = "DumpMempool";
    logging_function._M_len = 0xb;
    LogPrintFormatInternal<unsigned_long>
              (logging_function,source_file,0xbd,ALL,Info,(ConstevalFormatString<1U>)0xcb600e,
               &mempool_transactions_to_write);
    pTVar3 = vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar11 = vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
                   super__Vector_impl_data._M_start; pTVar11 != pTVar3; pTVar11 = pTVar11 + 1) {
      local_148._8_8_ =
           (pTVar11->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_148._0_8_ = &::TX_WITH_WITNESS;
      ParamsWrapper<TransactionSerParams,_const_CTransaction>::Serialize<AutoFile>
                ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)local_148,&file);
      ser_writedata64<AutoFile>(&file,(pTVar11->m_time).__r);
      ser_writedata64<AutoFile>(&file,pTVar11->nFeeDelta);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
      ::erase(&mapDeltas._M_t,
              &(((pTVar11->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->hash).m_wrapped);
    }
    Serialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
              (&file,&mapDeltas);
    local_148._0_8_ = unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
    ;
    source_file_00._M_len = 0x68;
    logging_function_00._M_str = "DumpMempool";
    logging_function_00._M_len = 0xb;
    ppVar12 = __p;
    lVar10 = lVar9;
    LogPrintFormatInternal<unsigned_long>
              (logging_function_00,source_file_00,199,ALL,Info,(ConstevalFormatString<1U>)0xcb603a,
               (unsigned_long *)local_148);
    __stream = (FILE *)&unbroadcast_txids;
    Serialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
              (&file,(set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)__stream);
    if ((char)in_ECX == '\0') {
      bVar4 = AutoFile::Commit(&file);
      if (bVar4) goto LAB_007a6883;
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Commit failed");
    }
    else {
LAB_007a6883:
      AutoFile::fclose(&file,__stream);
      std::filesystem::__cxx11::path::path(&local_198,__p);
      fs::operator+((path *)&local_170,(path *)&local_198,p2_00);
      std::filesystem::__cxx11::path::path(&local_1c0,__p);
      src.super_path._M_pathname._M_string_length._4_4_ = in_ECX;
      src.super_path._M_pathname._0_12_ = in_stack_fffffffffffffd58;
      src.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)ppVar12;
      src.super_path._M_pathname.field_2._8_8_ = lVar10;
      src.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )_Var6._M_head_impl;
      dest.super_path._M_pathname._M_string_length = (size_type)local_278;
      dest.super_path._M_pathname._M_dataplus._M_p = (pointer)local_280;
      dest.super_path._M_pathname.field_2._M_allocated_capacity = mempool_transactions_to_write;
      dest.super_path._24_16_ = local_268;
      bVar4 = RenameOver(src,dest);
      std::filesystem::__cxx11::path::~path(&local_1c0);
      std::filesystem::__cxx11::path::~path(&local_170);
      std::filesystem::__cxx11::path::~path(&local_198);
      if (bVar4) {
        lVar10 = std::chrono::_V2::steady_clock::now();
        local_148._0_8_ = (double)(lVar9 - (long)_Var6._M_head_impl) / 1000000000.0;
        local_278 = (double)(lVar10 - lVar9) / 1000000000.0;
        local_280 = std::filesystem::file_size((path *)__p);
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
        ;
        source_file_01._M_len = 0x68;
        logging_function_01._M_str = "DumpMempool";
        logging_function_01._M_len = 0xb;
        LogPrintFormatInternal<double,double,unsigned_long>
                  (logging_function_01,source_file_01,0xd5,ALL,Info,
                   (ConstevalFormatString<3U>)0xcb6084,(double *)local_148,&local_278,&local_280);
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                  (&xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
        bVar4 = true;
        goto LAB_007a6be2;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Rename failed");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool DumpMempool(const CTxMemPool& pool, const fs::path& dump_path, FopenFn mockable_fopen_function, bool skip_file_commit)
{
    auto start = SteadyClock::now();

    std::map<uint256, CAmount> mapDeltas;
    std::vector<TxMempoolInfo> vinfo;
    std::set<uint256> unbroadcast_txids;

    static Mutex dump_mutex;
    LOCK(dump_mutex);

    {
        LOCK(pool.cs);
        for (const auto &i : pool.mapDeltas) {
            mapDeltas[i.first] = i.second;
        }
        vinfo = pool.infoAll();
        unbroadcast_txids = pool.GetUnbroadcastTxs();
    }

    auto mid = SteadyClock::now();

    AutoFile file{mockable_fopen_function(dump_path + ".new", "wb")};
    if (file.IsNull()) {
        return false;
    }

    try {
        const uint64_t version{pool.m_opts.persist_v1_dat ? MEMPOOL_DUMP_VERSION_NO_XOR_KEY : MEMPOOL_DUMP_VERSION};
        file << version;

        std::vector<std::byte> xor_key(8);
        if (!pool.m_opts.persist_v1_dat) {
            FastRandomContext{}.fillrand(xor_key);
            file << xor_key;
        }
        file.SetXor(xor_key);

        uint64_t mempool_transactions_to_write(vinfo.size());
        file << mempool_transactions_to_write;
        LogInfo("Writing %u mempool transactions to file...\n", mempool_transactions_to_write);
        for (const auto& i : vinfo) {
            file << TX_WITH_WITNESS(*(i.tx));
            file << int64_t{count_seconds(i.m_time)};
            file << int64_t{i.nFeeDelta};
            mapDeltas.erase(i.tx->GetHash());
        }

        file << mapDeltas;

        LogInfo("Writing %d unbroadcast transactions to file.\n", unbroadcast_txids.size());
        file << unbroadcast_txids;

        if (!skip_file_commit && !file.Commit())
            throw std::runtime_error("Commit failed");
        file.fclose();
        if (!RenameOver(dump_path + ".new", dump_path)) {
            throw std::runtime_error("Rename failed");
        }
        auto last = SteadyClock::now();

        LogInfo("Dumped mempool: %.3fs to copy, %.3fs to dump, %d bytes dumped to file\n",
                  Ticks<SecondsDouble>(mid - start),
                  Ticks<SecondsDouble>(last - mid),
                  fs::file_size(dump_path));
    } catch (const std::exception& e) {
        LogInfo("Failed to dump mempool: %s. Continuing anyway.\n", e.what());
        return false;
    }
    return true;
}